

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O2

Value * __thiscall Kvm::evalAssignment(Kvm *this,Value *v,Value *env)

{
  Value *pVVar1;
  
  pVVar1 = eval(this,*(Value **)(*(long *)(*(long *)&v[1].type_ + 0x20) + 0x18),env);
  if (pVVar1 == (Value *)0x0) {
    pVVar1 = (Value *)0x0;
  }
  else {
    setVariableValue(this,*(Value **)(*(long *)&v[1].type_ + 0x18),pVVar1,env);
    pVVar1 = this->OK;
  }
  return pVVar1;
}

Assistant:

const Value* Kvm::evalAssignment(const Value *v, const Value *env)
{
    auto e = eval(assignmentValue(v), env);
    if (!e) return nullptr;
    setVariableValue(assignmentVariable(v), e, env);
    return OK;
}